

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,bool>
          (ArgBuilder *this,_func_void_ConfigData_ptr_bool *binaryFunction,string *placeholder)

{
  IArgFunction<Catch::ConfigData> *_functionObj;
  string *in_RDX;
  BoundBinaryFunction<Catch::ConfigData,_bool> *in_RDI;
  _func_void_ConfigData_ptr_bool *in_stack_ffffffffffffffb8;
  BoundArgFunction<Catch::ConfigData> *in_stack_ffffffffffffffd8;
  BoundArgFunction<Catch::ConfigData> in_stack_ffffffffffffffe0;
  
  _functionObj = (IArgFunction<Catch::ConfigData> *)operator_new(0x10);
  Detail::BoundBinaryFunction<Catch::ConfigData,_bool>::BoundBinaryFunction
            (in_RDI,in_stack_ffffffffffffffb8);
  Detail::BoundArgFunction<Catch::ConfigData>::BoundArgFunction
            ((BoundArgFunction<Catch::ConfigData> *)&stack0xffffffffffffffe0,_functionObj);
  Detail::BoundArgFunction<Catch::ConfigData>::operator=
            ((BoundArgFunction<Catch::ConfigData> *)in_stack_ffffffffffffffe0.functionObj,
             in_stack_ffffffffffffffd8);
  Detail::BoundArgFunction<Catch::ConfigData>::~BoundArgFunction
            ((BoundArgFunction<Catch::ConfigData> *)in_RDI);
  std::__cxx11::string::operator=
            ((string *)((in_RDI->super_IArgFunction<Catch::ConfigData>)._vptr_IArgFunction + 9),
             in_RDX);
  return;
}

Assistant:

void bind( void (* binaryFunction)( C&, T ), std::string const& placeholder ) {
                m_arg->boundField = new Detail::BoundBinaryFunction<C, T>( binaryFunction );
                m_arg->placeholder = placeholder;
            }